

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DatatypeValidatorFactory::expandRegistryToFullSchemaSet(DatatypeValidatorFactory *this)

{
  XMLSize_t XVar1;
  MemoryManager *pMVar2;
  int iVar3;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *pRVar4;
  undefined4 extraout_var;
  DatatypeValidator *pDVar5;
  DecimalDatatypeValidator *this_00;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *pRVar6;
  undefined4 extraout_var_00;
  KVStringPair *pKVar7;
  undefined4 extraout_var_01;
  DatatypeValidator *pDVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  XMLSize_t XVar9;
  size_t in_RSI;
  size_t sVar10;
  undefined2 *puVar11;
  undefined1 *puVar12;
  undefined8 *size;
  undefined6 *size_00;
  
  pRVar4 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,in_RSI);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar4->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar4->fAdoptedElems = true;
  pRVar4->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)0x0;
  pRVar4->fHashModulus = 0x1d;
  pRVar4->fInitialModulus = 0x1d;
  pRVar4->fCount = 0;
  sVar10 = 0xe8;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar4->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)CONCAT44(extraout_var,iVar3);
  XVar1 = pRVar4->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar4->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  fBuiltInRegistry = pRVar4;
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,sVar10);
  StringDatatypeValidator::StringDatatypeValidator
            ((StringDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"string",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_STRING;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_STRING,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar11);
  NOTATIONDatatypeValidator::NOTATIONDatatypeValidator
            ((NOTATIONDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"NOTATION",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &XMLUni::fgNotationString;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&XMLUni::fgNotationString,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x68,(size_t)puVar11);
  AnySimpleTypeDatatypeValidator::AnySimpleTypeDatatypeValidator
            ((AnySimpleTypeDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"anySimpleType",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_ANYSIMPLETYPE;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_ANYSIMPLETYPE,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x68,(size_t)puVar11);
  DatatypeValidator::DatatypeValidator
            (pDVar5,(DatatypeValidator *)0x0,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,0,Boolean,
             XMLPlatformUtils::fgMemoryManager);
  (pDVar5->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__DatatypeValidator_0040c6c8
  ;
  pDVar5->fFinite = true;
  DatatypeValidator::setTypeName(pDVar5,L"boolean",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_BOOLEAN;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_BOOLEAN,pDVar5);
  this_00 = (DecimalDatatypeValidator *)XMemory::operator_new((XMemory *)0xa8,(size_t)puVar11);
  DecimalDatatypeValidator::DecimalDatatypeValidator(this_00,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            ((DatatypeValidator *)this_00,L"decimal",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_DECIMAL;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_DECIMAL,(DatatypeValidator *)this_00);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar11);
  HexBinaryDatatypeValidator::HexBinaryDatatypeValidator
            ((HexBinaryDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"hexBinary",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_HEXBINARY;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_HEXBINARY,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar11);
  Base64BinaryDatatypeValidator::Base64BinaryDatatypeValidator
            ((Base64BinaryDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"base64Binary",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_BASE64BINARY;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_BASE64BINARY,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  DoubleDatatypeValidator::DoubleDatatypeValidator
            ((DoubleDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"double",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_DOUBLE;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_DOUBLE,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  FloatDatatypeValidator::FloatDatatypeValidator
            ((FloatDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"float",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_FLOAT;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_FLOAT,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar11);
  AnyURIDatatypeValidator::AnyURIDatatypeValidator
            ((AnyURIDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"anyURI",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_ANYURI;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_ANYURI,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar11);
  QNameDatatypeValidator::QNameDatatypeValidator
            ((QNameDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"QName",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_QNAME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_QNAME,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  DateTimeDatatypeValidator::DateTimeDatatypeValidator
            ((DateTimeDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"dateTime",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_DATETIME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_DATETIME,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  DateDatatypeValidator::DateDatatypeValidator
            ((DateDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"date",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_DATE;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_DATE,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  TimeDatatypeValidator::TimeDatatypeValidator
            ((TimeDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"time",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_TIME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_TIME,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  DayDatatypeValidator::DayDatatypeValidator
            ((DayDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"gDay",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_DAY;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_DAY,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  MonthDatatypeValidator::MonthDatatypeValidator
            ((MonthDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"gMonth",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_MONTH;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_MONTH,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  MonthDayDatatypeValidator::MonthDayDatatypeValidator
            ((MonthDayDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"gMonthDay",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_MONTHDAY;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_MONTHDAY,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  YearDatatypeValidator::YearDatatypeValidator
            ((YearDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"gYear",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_YEAR;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_YEAR,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  YearMonthDatatypeValidator::YearMonthDatatypeValidator
            ((YearMonthDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"gYearMonth",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_YEARMONTH;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_YEARMONTH,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0xa0,(size_t)puVar11);
  DurationDatatypeValidator::DurationDatatypeValidator
            ((DurationDatatypeValidator *)pDVar5,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"duration",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_DURATION;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_DURATION,pDVar5);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar11);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 3;
  pRVar6->fInitialModulus = 3;
  pRVar6->fCount = 0;
  sVar10 = 0x18;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_00,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"whiteSpace",L"replace",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_WHITESPACE,pKVar7);
  pDVar5 = getDatatypeValidator(this,L"string");
  puVar12 = SchemaSymbols::fgDT_NORMALIZEDSTRING;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_NORMALIZEDSTRING,pDVar5,pRVar6,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 3;
  pRVar6->fInitialModulus = 3;
  pRVar6->fCount = 0;
  sVar10 = 0x18;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_01,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"whiteSpace",L"collapse",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_WHITESPACE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NORMALIZEDSTRING);
  puVar12 = SchemaSymbols::fgDT_TOKEN;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_TOKEN,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0
             ,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar12);
  pDVar8 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_TOKEN);
  NameDatatypeValidator::NameDatatypeValidator
            ((NameDatatypeValidator *)pDVar5,pDVar8,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"Name",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_NAME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_NAME,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar11);
  pDVar8 = getDatatypeValidator(this,L"Name");
  NCNameDatatypeValidator::NCNameDatatypeValidator
            ((NCNameDatatypeValidator *)pDVar5,pDVar8,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"NCName",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &SchemaSymbols::fgDT_NCNAME;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&SchemaSymbols::fgDT_NCNAME,pDVar5);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar11);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 3;
  pRVar6->fInitialModulus = 3;
  pRVar6->fCount = 0;
  sVar10 = 0x18;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_02,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"pattern",L"\\c+",XMLPlatformUtils::fgMemoryManager);
  puVar11 = &SchemaSymbols::fgELT_PATTERN;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_PATTERN,pKVar7);
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar11);
  KVStringPair::KVStringPair(pKVar7,L"whiteSpace",L"collapse",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_WHITESPACE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_TOKEN);
  puVar12 = XMLUni::fgNmTokenString;
  createDatatypeValidator
            (this,(XMLCh *)XMLUni::fgNmTokenString,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0,
             false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_03,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"minLength",L"1",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MINLENGTH,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)XMLUni::fgNmTokenString);
  puVar12 = XMLUni::fgNmTokensString;
  createDatatypeValidator
            (this,(XMLCh *)XMLUni::fgNmTokensString,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0,
             true,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 3;
  pRVar6->fInitialModulus = 3;
  pRVar6->fCount = 0;
  sVar10 = 0x18;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_04,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair
            (pKVar7,L"pattern",(XMLCh *)XMLUni::fgLangPattern,XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_PATTERN,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_TOKEN);
  puVar12 = SchemaSymbols::fgDT_LANGUAGE;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_LANGUAGE,pDVar5,pRVar6,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 3;
  pRVar6->fInitialModulus = 3;
  pRVar6->fCount = 0;
  sVar10 = 0x18;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_05,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"fractionDigits",L"0",XMLPlatformUtils::fgMemoryManager);
  puVar11 = &SchemaSymbols::fgELT_FRACTIONDIGITS;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_FRACTIONDIGITS,pKVar7);
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar11);
  KVStringPair::KVStringPair
            (pKVar7,L"pattern",(XMLCh *)fgIntegerPattern,XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_PATTERN,pKVar7);
  pDVar5 = getDatatypeValidator(this,L"decimal");
  puVar12 = SchemaSymbols::fgDT_INTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_INTEGER,pDVar5,pRVar6,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_06,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"maxInclusive",L"0",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_INTEGER);
  puVar12 = SchemaSymbols::fgDT_NONPOSITIVEINTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_NONPOSITIVEINTEGER,pDVar5,pRVar6,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_07,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"maxInclusive",L"-1",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
  puVar12 = SchemaSymbols::fgDT_NEGATIVEINTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_NEGATIVEINTEGER,pDVar5,pRVar6,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_08,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair
            (pKVar7,L"maxInclusive",(XMLCh *)XMLUni::fgLongMaxInc,XMLPlatformUtils::fgMemoryManager)
  ;
  puVar11 = &SchemaSymbols::fgELT_MAXINCLUSIVE;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar11);
  KVStringPair::KVStringPair
            (pKVar7,L"minInclusive",(XMLCh *)XMLUni::fgLongMinInc,XMLPlatformUtils::fgMemoryManager)
  ;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MININCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_INTEGER);
  puVar12 = SchemaSymbols::fgDT_LONG;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_LONG,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0,
             false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_09,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair
            (pKVar7,L"maxInclusive",(XMLCh *)XMLUni::fgIntMaxInc,XMLPlatformUtils::fgMemoryManager);
  puVar11 = &SchemaSymbols::fgELT_MAXINCLUSIVE;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar11);
  KVStringPair::KVStringPair
            (pKVar7,L"minInclusive",(XMLCh *)XMLUni::fgIntMinInc,XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MININCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_LONG);
  size = &SchemaSymbols::fgDT_INT;
  createDatatypeValidator
            (this,L"int",pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0,false,0,false,
             XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)size);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_10,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair
            (pKVar7,L"maxInclusive",(XMLCh *)XMLUni::fgShortMaxInc,XMLPlatformUtils::fgMemoryManager
            );
  puVar11 = &SchemaSymbols::fgELT_MAXINCLUSIVE;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar11);
  KVStringPair::KVStringPair
            (pKVar7,L"minInclusive",(XMLCh *)XMLUni::fgShortMinInc,XMLPlatformUtils::fgMemoryManager
            );
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MININCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,L"int");
  puVar12 = SchemaSymbols::fgDT_SHORT;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_SHORT,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0
             ,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_11,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"maxInclusive",L"127",XMLPlatformUtils::fgMemoryManager);
  puVar11 = &SchemaSymbols::fgELT_MAXINCLUSIVE;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,(size_t)puVar11);
  KVStringPair::KVStringPair
            (pKVar7,L"minInclusive",(XMLCh *)XMLUni::fgByteMinInc,XMLPlatformUtils::fgMemoryManager)
  ;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MININCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_SHORT);
  puVar12 = SchemaSymbols::fgDT_BYTE;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_BYTE,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0,
             false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_12,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"minInclusive",L"0",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MININCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_INTEGER);
  puVar12 = SchemaSymbols::fgDT_NONNEGATIVEINTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_NONNEGATIVEINTEGER,pDVar5,pRVar6,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_13,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair
            (pKVar7,L"maxInclusive",(XMLCh *)XMLUni::fgULongMaxInc,XMLPlatformUtils::fgMemoryManager
            );
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  puVar12 = SchemaSymbols::fgDT_ULONG;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_ULONG,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0
             ,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_14,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair
            (pKVar7,L"maxInclusive",(XMLCh *)XMLUni::fgUIntMaxInc,XMLPlatformUtils::fgMemoryManager)
  ;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_ULONG);
  puVar12 = SchemaSymbols::fgDT_UINT;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_UINT,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0,
             false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_15,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair
            (pKVar7,L"maxInclusive",(XMLCh *)XMLUni::fgUShortMaxInc,
             XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_UINT);
  puVar12 = SchemaSymbols::fgDT_USHORT;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_USHORT,pDVar5,pRVar6,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_16,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"maxInclusive",L"255",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MAXINCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_USHORT);
  puVar12 = SchemaSymbols::fgDT_UBYTE;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_UBYTE,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0
             ,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_17,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"minInclusive",L"1",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MININCLUSIVE,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  puVar12 = SchemaSymbols::fgDT_POSITIVEINTEGER;
  createDatatypeValidator
            (this,(XMLCh *)SchemaSymbols::fgDT_POSITIVEINTEGER,pDVar5,pRVar6,
             (RefArrayVectorOf<char16_t> *)0x0,false,0,false,XMLPlatformUtils::fgMemoryManager);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar12);
  pDVar8 = getDatatypeValidator(this,L"NCName");
  IDDatatypeValidator::IDDatatypeValidator
            ((IDDatatypeValidator *)pDVar5,pDVar8,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"ID",L"http://www.w3.org/2001/XMLSchema");
  size_00 = &XMLUni::fgIDString;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&XMLUni::fgIDString,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)size_00);
  pDVar8 = getDatatypeValidator(this,L"NCName");
  IDREFDatatypeValidator::IDREFDatatypeValidator
            ((IDREFDatatypeValidator *)pDVar5,pDVar8,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName
            (pDVar5,(XMLCh *)XMLUni::fgIDRefString,L"http://www.w3.org/2001/XMLSchema");
  puVar12 = XMLUni::fgIDRefString;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,XMLUni::fgIDRefString,pDVar5);
  pDVar5 = (DatatypeValidator *)XMemory::operator_new((XMemory *)0x90,(size_t)puVar12);
  pDVar8 = getDatatypeValidator(this,L"NCName");
  ENTITYDatatypeValidator::ENTITYDatatypeValidator
            ((ENTITYDatatypeValidator *)pDVar5,pDVar8,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,
             (RefArrayVectorOf<char16_t> *)0x0,0,XMLPlatformUtils::fgMemoryManager);
  DatatypeValidator::setTypeName(pDVar5,L"ENTITY",L"http://www.w3.org/2001/XMLSchema");
  puVar11 = &XMLUni::fgEntityString;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (fBuiltInRegistry,&XMLUni::fgEntityString,pDVar5);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar11);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_18,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"minLength",L"1",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MINLENGTH,pKVar7);
  pDVar5 = getDatatypeValidator(this,(XMLCh *)XMLUni::fgIDRefString);
  puVar12 = XMLUni::fgIDRefsString;
  createDatatypeValidator
            (this,(XMLCh *)XMLUni::fgIDRefsString,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0,
             true,0,false,XMLPlatformUtils::fgMemoryManager);
  pRVar6 = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new((XMemory *)0x38,(size_t)puVar12);
  pMVar2 = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pRVar6->fAdoptedElems = true;
  pRVar6->fBucketList = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)0x0;
  pRVar6->fHashModulus = 2;
  pRVar6->fInitialModulus = 2;
  pRVar6->fCount = 0;
  sVar10 = 0x10;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar6->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::KVStringPair> **)CONCAT44(extraout_var_19,iVar3);
  XVar1 = pRVar6->fHashModulus;
  if (XVar1 != 0) {
    XVar9 = 0;
    do {
      pRVar6->fBucketList[XVar9] = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
      XVar9 = XVar9 + 1;
    } while (XVar1 != XVar9);
  }
  pKVar7 = (KVStringPair *)XMemory::operator_new((XMemory *)0x30,sVar10);
  KVStringPair::KVStringPair(pKVar7,L"minLength",L"1",XMLPlatformUtils::fgMemoryManager);
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
            (pRVar6,&SchemaSymbols::fgELT_MINLENGTH,pKVar7);
  pDVar5 = getDatatypeValidator(this,L"ENTITY");
  createDatatypeValidator
            (this,(XMLCh *)XMLUni::fgEntitiesString,pDVar5,pRVar6,(RefArrayVectorOf<char16_t> *)0x0,
             true,0,false,XMLPlatformUtils::fgMemoryManager);
  initCanRepRegistory(this);
  return;
}

Assistant:

void DatatypeValidatorFactory::expandRegistryToFullSchemaSet()
{
    //Initialize common Schema/DTD Datatype validator set
    fBuiltInRegistry = new RefHashTableOf<DatatypeValidator>(29);

    DatatypeValidator *dv = new StringDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_STRING, dv);

    dv = new NOTATIONDatatypeValidator();
    dv->setTypeName(XMLUni::fgNotationString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) XMLUni::fgNotationString, dv);

    dv = new AnySimpleTypeDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_ANYSIMPLETYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_ANYSIMPLETYPE, dv);

    dv = new BooleanDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_BOOLEAN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_BOOLEAN, dv);

    dv = new DecimalDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DECIMAL, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DECIMAL, dv);

    dv = new HexBinaryDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_HEXBINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_HEXBINARY, dv);

    dv = new Base64BinaryDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_BASE64BINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_BASE64BINARY, dv);

    dv = new DoubleDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DOUBLE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DOUBLE, dv);

    dv = new FloatDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_FLOAT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_FLOAT, dv);

    dv = new AnyURIDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_ANYURI, dv);

    dv = new QNameDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_QNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_QNAME, dv);

    dv = new DateTimeDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DATETIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DATETIME, dv);

    dv = new DateDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DATE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DATE, dv);

    dv = new TimeDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_TIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_TIME, dv);

    dv = new DayDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DAY, dv);

    dv = new MonthDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_MONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_MONTH, dv);

    dv = new MonthDayDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_MONTHDAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_MONTHDAY, dv);

    dv = new YearDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_YEAR, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_YEAR, dv);

    dv = new YearMonthDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_YEARMONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_YEARMONTH, dv);

    dv = new DurationDatatypeValidator();
    dv->setTypeName(SchemaSymbols::fgDT_DURATION, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_DURATION, dv);

    // REVISIT
    // We are creating a lot of Hashtables for the facets of the different
    // validators. It's better to have some kind of a memory pool and ask
    // the pool to give us a new instance of the hashtable.
    RefHashTableOf<KVStringPair>* facets = new RefHashTableOf<KVStringPair>(3);

    // Create 'normalizedString' datatype validator
    facets->put((void*) SchemaSymbols::fgELT_WHITESPACE,
                new KVStringPair(SchemaSymbols::fgELT_WHITESPACE, SchemaSymbols::fgWS_REPLACE));

    createDatatypeValidator(SchemaSymbols::fgDT_NORMALIZEDSTRING,
                            getDatatypeValidator(SchemaSymbols::fgDT_STRING),
                            facets, 0, false, 0, false);

    // Create 'token' datatype validator
    facets = new RefHashTableOf<KVStringPair>(3);
    facets->put((void*) SchemaSymbols::fgELT_WHITESPACE,
                new KVStringPair(SchemaSymbols::fgELT_WHITESPACE, SchemaSymbols::fgWS_COLLAPSE));

    createDatatypeValidator(SchemaSymbols::fgDT_TOKEN,
                            getDatatypeValidator(SchemaSymbols::fgDT_NORMALIZEDSTRING),
                            facets, 0, false, 0, false);


    dv = new NameDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_TOKEN), 0, 0, 0);
    dv->setTypeName(SchemaSymbols::fgDT_NAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_NAME, dv);


    dv = new NCNameDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_NAME), 0, 0, 0);
    dv->setTypeName(SchemaSymbols::fgDT_NCNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) SchemaSymbols::fgDT_NCNAME, dv);

    // Create 'NMTOKEN' datatype validator
    facets = new RefHashTableOf<KVStringPair>(3);

    facets->put((void*) SchemaSymbols::fgELT_PATTERN ,
                new KVStringPair(SchemaSymbols::fgELT_PATTERN,fgTokPattern));
    facets->put((void*) SchemaSymbols::fgELT_WHITESPACE,
                new KVStringPair(SchemaSymbols::fgELT_WHITESPACE, SchemaSymbols::fgWS_COLLAPSE));

    createDatatypeValidator(XMLUni::fgNmTokenString,
                            getDatatypeValidator(SchemaSymbols::fgDT_TOKEN),facets, 0, false, 0, false);

    // Create 'NMTOKENS' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);
    facets->put((void*) SchemaSymbols::fgELT_MINLENGTH,
                new KVStringPair(SchemaSymbols::fgELT_MINLENGTH, XMLUni::fgValueOne));

    createDatatypeValidator(XMLUni::fgNmTokensString,
                            getDatatypeValidator(XMLUni::fgNmTokenString), facets, 0, true, 0, false);

    // Create 'language' datatype validator
    facets = new RefHashTableOf<KVStringPair>(3);

    facets->put((void*) SchemaSymbols::fgELT_PATTERN,
                new KVStringPair(SchemaSymbols::fgELT_PATTERN, XMLUni::fgLangPattern));

    createDatatypeValidator(SchemaSymbols::fgDT_LANGUAGE,
                            getDatatypeValidator(SchemaSymbols::fgDT_TOKEN),
                            facets, 0, false, 0, false);

    // Create 'integer' datatype validator
    facets = new RefHashTableOf<KVStringPair>(3);

    facets->put((void*) SchemaSymbols::fgELT_FRACTIONDIGITS,
                new KVStringPair(SchemaSymbols::fgELT_FRACTIONDIGITS, XMLUni::fgValueZero));

    facets->put((void*) SchemaSymbols::fgELT_PATTERN,
                new KVStringPair(SchemaSymbols::fgELT_PATTERN, fgIntegerPattern));

    createDatatypeValidator(SchemaSymbols::fgDT_INTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_DECIMAL),
                            facets, 0, false, 0, false);

    // Create 'nonPositiveInteger' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgValueZero));

    createDatatypeValidator(SchemaSymbols::fgDT_NONPOSITIVEINTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_INTEGER),
                            facets, 0, false, 0, false);

    // Create 'negativeInteger' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgNegOne));

    createDatatypeValidator(SchemaSymbols::fgDT_NEGATIVEINTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_NONPOSITIVEINTEGER),
                            facets, 0, false, 0, false);

    // Create 'long' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgLongMaxInc));
    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgLongMinInc));

    createDatatypeValidator(SchemaSymbols::fgDT_LONG,
                            getDatatypeValidator(SchemaSymbols::fgDT_INTEGER),
                            facets, 0, false, 0, false);

    // Create 'int' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgIntMaxInc));
    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgIntMinInc));

    createDatatypeValidator(SchemaSymbols::fgDT_INT,
                            getDatatypeValidator(SchemaSymbols::fgDT_LONG),
                            facets, 0, false, 0, false);

    // Create 'short' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgShortMaxInc));
    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgShortMinInc));

    createDatatypeValidator(SchemaSymbols::fgDT_SHORT,
                            getDatatypeValidator(SchemaSymbols::fgDT_INT),
                            facets, 0, false, 0 ,false);

    // Create 'byte' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgByteMaxInc));
    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgByteMinInc));

    createDatatypeValidator(SchemaSymbols::fgDT_BYTE,
                            getDatatypeValidator(SchemaSymbols::fgDT_SHORT),
                            facets, 0, false, 0, false);

    // Create 'nonNegativeInteger' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgValueZero));

    createDatatypeValidator(SchemaSymbols::fgDT_NONNEGATIVEINTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_INTEGER),
                            facets, 0, false, 0, false);

    // Create 'unsignedLong' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgULongMaxInc));

    createDatatypeValidator(SchemaSymbols::fgDT_ULONG,
                            getDatatypeValidator(SchemaSymbols::fgDT_NONNEGATIVEINTEGER),
                            facets, 0, false, 0, false);

    // Create 'unsignedInt' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgUIntMaxInc));

    createDatatypeValidator(SchemaSymbols::fgDT_UINT,
                            getDatatypeValidator(SchemaSymbols::fgDT_ULONG),
                            facets, 0, false, 0, false);

    // Create 'unsignedShort' datatypeValidator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgUShortMaxInc));

    createDatatypeValidator(SchemaSymbols::fgDT_USHORT,
                            getDatatypeValidator(SchemaSymbols::fgDT_UINT),
                            facets, 0, false, 0, false);

    // Create 'unsignedByte' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MAXINCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MAXINCLUSIVE, XMLUni::fgUByteMaxInc));

    createDatatypeValidator(SchemaSymbols::fgDT_UBYTE,
                            getDatatypeValidator(SchemaSymbols::fgDT_USHORT),
                            facets, 0, false, 0, false);

    // Create 'positiveInteger' datatype validator
    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MININCLUSIVE,
                new KVStringPair(SchemaSymbols::fgELT_MININCLUSIVE, XMLUni::fgValueOne));

    createDatatypeValidator(SchemaSymbols::fgDT_POSITIVEINTEGER,
                            getDatatypeValidator(SchemaSymbols::fgDT_NONNEGATIVEINTEGER),
                            facets, 0, false, 0, false);

    // Create 'ID', 'IDREF' and 'ENTITY' datatype validator
    dv = new IDDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_NCNAME), 0, 0, 0);
    dv->setTypeName(XMLUni::fgIDString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) XMLUni::fgIDString, dv);

    dv = new IDREFDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_NCNAME), 0, 0, 0);
    dv->setTypeName(XMLUni::fgIDRefString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) XMLUni::fgIDRefString, dv);

    dv = new ENTITYDatatypeValidator(getDatatypeValidator(SchemaSymbols::fgDT_NCNAME), 0, 0, 0);
    dv->setTypeName(XMLUni::fgEntityString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    fBuiltInRegistry->put((void*) XMLUni::fgEntityString, dv);

    facets = new RefHashTableOf<KVStringPair>(2);
    facets->put((void*) SchemaSymbols::fgELT_MINLENGTH,
                new KVStringPair(SchemaSymbols::fgELT_MINLENGTH, XMLUni::fgValueOne));

    // Create 'IDREFS' datatype validator
    createDatatypeValidator
      (
        XMLUni::fgIDRefsString
        , getDatatypeValidator(XMLUni::fgIDRefString)
        , facets
        , 0
        , true
        , 0
        , false
      );

    facets = new RefHashTableOf<KVStringPair>(2);

    facets->put((void*) SchemaSymbols::fgELT_MINLENGTH,
                new KVStringPair(SchemaSymbols::fgELT_MINLENGTH, XMLUni::fgValueOne));

    // Create 'ENTITIES' datatype validator
    createDatatypeValidator
      (
        XMLUni::fgEntitiesString
        , getDatatypeValidator(XMLUni::fgEntityString)
        , facets
        , 0
        , true
        , 0
        , false
      );

    initCanRepRegistory();
}